

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O3

int ORPG::Characters::request_selection(RaceSelector *factory)

{
  race_node *prVar1;
  pointer pcVar2;
  pointer __nptr;
  ostream *poVar3;
  int *piVar4;
  undefined8 uVar5;
  long lVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  size_type sVar10;
  ulong uVar11;
  bool bVar12;
  string str;
  string input;
  undefined1 local_c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  pointer local_98;
  pointer local_90;
  long local_88;
  undefined1 local_80 [32];
  long local_60;
  long local_58 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_90 = (pointer)local_80;
  local_88 = 0;
  local_80[0] = 0;
  local_98 = (pointer)0x0;
  local_a8._M_allocated_capacity = 0;
  local_a8._8_8_ = (pointer)0x0;
  prVar1 = factory->current;
  if ((prVar1 != (race_node *)0x0) &&
     ((prVar1->children).
      super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (prVar1->children).
      super__Vector_base<ORPG::Characters::RaceSelector::race_node_*,_std::allocator<ORPG::Characters::RaceSelector::race_node_*>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    RaceSelector::current_options_abi_cxx11_(&local_48,factory);
    local_c8._16_8_ = local_98;
    local_c8._8_8_ = local_a8._8_8_;
    local_c8._0_8_ = local_a8._M_allocated_capacity;
    local_98 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a8._M_allocated_capacity =
         (size_type)
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_a8._8_8_ =
         local_48.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  sVar10 = 0xffffffff;
  do {
    uVar5 = local_a8._8_8_;
    iVar8 = (int)sVar10;
    if ((-1 < iVar8) && (iVar8 < (int)((ulong)(local_a8._8_8_ - local_a8._0_8_) >> 5))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_a8);
      if (local_90 != (pointer)local_80) {
        operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
      }
      return iVar8;
    }
    local_80._16_8_ = sVar10;
    if (local_a8._M_allocated_capacity != local_a8._8_8_) {
      iVar8 = 0;
      iVar9 = -1;
      uVar11 = 1;
      uVar7 = local_a8._M_allocated_capacity;
      do {
        local_c8._0_8_ = local_c8 + 0x10;
        pcVar2 = (((pointer)uVar7)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_c8,pcVar2,pcVar2 + ((pointer)uVar7)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,") ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,(char *)local_c8._0_8_,local_c8._8_8_);
        if ((int)(uVar11 / 3) * 3 + iVar9 == 0) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
          std::ostream::put('P');
          std::ostream::flush();
        }
        if ((pointer)local_c8._0_8_ != (pointer)(local_c8 + 0x10)) {
          operator_delete((void *)local_c8._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_c8._16_8_)->_M_p + 1));
        }
        uVar7 = uVar7 + 0x20;
        iVar9 = iVar9 + -1;
        uVar11 = (ulong)((int)uVar11 + 1);
        iVar8 = iVar8 + 1;
      } while (uVar7 != uVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n#? ",4);
    sVar10 = local_80._16_8_;
    ORPG::Utils::safeGetline((istream *)&std::cin,(string *)&local_90);
    local_80._24_8_ = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_80 + 0x18),local_90,
               (char *)((long)&(local_90->_M_dataplus)._M_p + local_88));
    if (local_60 != 0) {
      lVar6 = 0;
      do {
        if (9 < (int)*(char *)(local_80._24_8_ + lVar6) - 0x30U) {
          bVar12 = false;
          goto LAB_0010a2f3;
        }
        lVar6 = lVar6 + 1;
      } while (local_60 != lVar6);
    }
    bVar12 = local_60 != 0;
LAB_0010a2f3:
    if ((long *)local_80._24_8_ != local_58) {
      operator_delete((void *)local_80._24_8_,local_58[0] + 1);
    }
    __nptr = local_90;
    if (bVar12) {
      piVar4 = __errno_location();
      iVar8 = *piVar4;
      *piVar4 = 0;
      sVar10 = strtol((char *)__nptr,(char **)local_c8,10);
      if ((pointer)local_c8._0_8_ == __nptr) {
        std::__throw_invalid_argument("stoi");
LAB_0010a406:
        uVar5 = std::__throw_out_of_range("stoi");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a8);
        if (local_90 != (pointer)local_80) {
          operator_delete(local_90,CONCAT71(local_80._1_7_,local_80[0]) + 1);
        }
        _Unwind_Resume(uVar5);
      }
      if (((long)(int)sVar10 != sVar10) || (*piVar4 == 0x22)) goto LAB_0010a406;
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"invalid input!",0xe)
      ;
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'P');
      std::ostream::put('P');
      std::ostream::flush();
    }
    std::ios::clear((int)*(undefined8 *)(std::cin + -0x18) + 0x120218);
  } while( true );
}

Assistant:

uint RaceSelector::current_id() {
            if(current != NULL) return current->raceID;
            return -1;
        }